

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentsHelper.cxx
# Opt level: O3

void __thiscall cmCommandArgument::ApplyOwnGroup(cmCommandArgument *this)

{
  cmCommandArgumentGroup *pcVar1;
  pointer ppcVar2;
  pointer ppcVar3;
  cmCommandArgument *cargs;
  cmCommandArgument *local_30;
  
  pcVar1 = this->Group;
  if (pcVar1 != (cmCommandArgumentGroup *)0x0) {
    ppcVar3 = (pcVar1->ContainedArguments).
              super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppcVar2 = (pcVar1->ContainedArguments).
              super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppcVar3 != ppcVar2) {
      do {
        local_30 = *ppcVar3;
        if (local_30 != this) {
          std::
          _Rb_tree<cmCommandArgument_const*,cmCommandArgument_const*,std::_Identity<cmCommandArgument_const*>,std::less<cmCommandArgument_const*>,std::allocator<cmCommandArgument_const*>>
          ::_M_insert_unique<cmCommandArgument_const*const&>
                    ((_Rb_tree<cmCommandArgument_const*,cmCommandArgument_const*,std::_Identity<cmCommandArgument_const*>,std::less<cmCommandArgument_const*>,std::allocator<cmCommandArgument_const*>>
                      *)&this->ArgumentsBefore,&local_30);
        }
        ppcVar3 = ppcVar3 + 1;
      } while (ppcVar3 != ppcVar2);
    }
  }
  return;
}

Assistant:

void cmCommandArgument::ApplyOwnGroup()
{
  if (this->Group != nullptr) {
    for (cmCommandArgument* cargs : this->Group->ContainedArguments) {
      if (cargs != this) {
        this->ArgumentsBefore.insert(cargs);
      }
    }
  }
}